

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiTextFilter::Build(ImGuiTextFilter *this)

{
  int *piVar1;
  int iVar2;
  ImGuiTextRange *pIVar3;
  ImGuiTextRange *pIVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  ImGuiTextRange input_range;
  ImGuiTextRange local_38;
  
  iVar2 = (this->Filters).Capacity;
  if (iVar2 < 0) {
    uVar7 = iVar2 / 2 + iVar2;
    uVar6 = 0;
    if (0 < (int)uVar7) {
      uVar6 = (ulong)uVar7;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    pIVar4 = (ImGuiTextRange *)(*GImAllocatorAllocFunc)(uVar6 << 4,GImAllocatorUserData);
    pIVar3 = (this->Filters).Data;
    if (pIVar3 != (ImGuiTextRange *)0x0) {
      memcpy(pIVar4,pIVar3,(long)(this->Filters).Size << 4);
      pIVar3 = (this->Filters).Data;
      if ((pIVar3 != (ImGuiTextRange *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
    }
    (this->Filters).Data = pIVar4;
    (this->Filters).Capacity = (int)uVar6;
  }
  (this->Filters).Size = 0;
  sVar5 = strlen(this->InputBuf);
  local_38.e = this->InputBuf + sVar5;
  local_38.b = this->InputBuf;
  ImGuiTextRange::split(&local_38,',',&this->Filters);
  this->CountGrep = 0;
  if ((this->Filters).Size != 0) {
    uVar6 = 0;
    do {
      pIVar4 = (this->Filters).Data;
      pIVar3 = pIVar4 + uVar6;
      pcVar8 = pIVar4[uVar6].b;
      if (pcVar8 < pIVar4[uVar6].e) {
        do {
          if ((*pcVar8 != ' ') && (*pcVar8 != '\t')) break;
          pcVar8 = pcVar8 + 1;
          pIVar3->b = pcVar8;
        } while (pcVar8 < pIVar3->e);
      }
      pcVar9 = pIVar3->b;
      pcVar8 = pIVar3->e;
      if (pcVar9 < pcVar8) {
        do {
          pcVar10 = pcVar8 + -1;
          if ((*pcVar10 != ' ') && (*pcVar10 != '\t')) break;
          pIVar3->e = pcVar10;
          pcVar9 = pIVar3->b;
          pcVar8 = pcVar10;
        } while (pcVar9 < pcVar10);
      }
      if ((pcVar9 != pcVar8) && (*(this->Filters).Data[uVar6].b != '-')) {
        this->CountGrep = this->CountGrep + 1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)(this->Filters).Size);
  }
  return;
}

Assistant:

void ImGuiTextFilter::Build()
{
    Filters.resize(0);
    ImGuiTextRange input_range(InputBuf, InputBuf + strlen(InputBuf));
    input_range.split(',', &Filters);

    CountGrep = 0;
    for (int i = 0; i != Filters.Size; i++)
    {
        ImGuiTextRange& f = Filters[i];
        while (f.b < f.e && ImCharIsBlankA(f.b[0]))
            f.b++;
        while (f.e > f.b && ImCharIsBlankA(f.e[-1]))
            f.e--;
        if (f.empty())
            continue;
        if (Filters[i].b[0] != '-')
            CountGrep += 1;
    }
}